

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Smf.cpp
# Opt level: O3

HeaderChunk rlib::midi::Smf::Inner::read<rlib::midi::Smf::Inner::HeaderChunk>(istream *is)

{
  long lVar1;
  runtime_error *this;
  HeaderChunk HVar2;
  undefined8 local_20;
  uint local_18;
  uint local_14;
  
  local_20 = 0x66468544d;
  local_18 = 0;
  local_14 = local_14 & 0xffff0000;
  lVar1 = std::istream::read((char *)is,(long)&local_20);
  if (0xd < *(ulong *)(lVar1 + 8)) {
    HVar2._8_6_ = (uint6)local_14 << 0x20 | (uint6)local_18;
    HVar2.MThd._M_elems[0] = (undefined1)local_20;
    HVar2.MThd._M_elems[1] = local_20._1_1_;
    HVar2.MThd._M_elems[2] = local_20._2_1_;
    HVar2.MThd._M_elems[3] = local_20._3_1_;
    HVar2.dataLength = local_20._4_4_;
    return HVar2;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"size error");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static T read(std::istream& is) {
		typename std::remove_const<T>::type buf;
		if (is.read(reinterpret_cast<char*>(&buf), sizeof(buf)).gcount() < sizeof(buf)) {
			throw std::runtime_error("size error");
		}
		return buf;
	}